

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional5::executeTest
          (PipelineStatisticsQueryTestFunctional5 *this,GLenum current_query_target)

{
  GLuint qo_id;
  GLuint qo_bo_id;
  TestContext *test_context;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *context_info;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  GLenum value;
  string local_258;
  MessageBuilder local_228;
  _draw_call_type local_a8;
  uint uStack_a4;
  uint n_draw_call_type;
  uint index_data [3];
  float vertex_data [6];
  undefined1 local_70 [4];
  uint n_vertex_components;
  _test_execution_result run_result;
  bool result;
  Functions *gl;
  GLenum current_query_target_local;
  PipelineStatisticsQueryTestFunctional5 *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  run_result.result_uint64._7_1_ = 1;
  PipelineStatisticsQueryUtilities::_test_execution_result::_test_execution_result
            ((_test_execution_result *)local_70);
  index_data[1] = 0xbdcccccd;
  index_data[2] = 0x3e4ccccd;
  _uStack_a4 = 0x100000002;
  index_data[0] = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_baseinstance_argument
       = 1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_basevertex_argument =
       1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 3;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       4;
  PipelineStatisticsQueryTestFunctionalBase::initVBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,(float *)(index_data + 1),0x18,
             &uStack_a4,0xc,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_count_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_primcount_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_baseinstance_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_first_argument,
             (this->super_PipelineStatisticsQueryTestFunctionalBase).
             m_indirect_draw_call_basevertex_argument);
  PipelineStatisticsQueryTestFunctionalBase::initVAO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,2);
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type =
       PRIMITIVE_TYPE_PATCHES;
  for (local_a8 = DRAW_CALL_TYPE_GLDRAWARRAYS; local_a8 < DRAW_CALL_TYPE_COUNT;
      local_a8 = local_a8 + DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT) {
    (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type = local_a8;
    bVar1 = PipelineStatisticsQueryUtilities::isDrawCallSupported
                      ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                       m_current_draw_call_type,(Functions *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      qo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id;
      qo_bo_id = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id;
      pRVar3 = deqp::Context::getRenderContext
                         ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                          m_context);
      test_context = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                     super_TestCase.super_TestNode.m_testCtx;
      context_info = deqp::Context::getContextInfo
                               ((this->super_PipelineStatisticsQueryTestFunctionalBase).
                                super_TestCase.m_context);
      bVar1 = PipelineStatisticsQueryUtilities::executeQuery
                        (current_query_target,qo_id,qo_bo_id,
                         PipelineStatisticsQueryTestFunctionalBase::queryCallbackDrawCallHandler,
                         this,pRVar3,test_context,context_info,(_test_execution_result *)local_70);
      if (bVar1) {
        bVar1 = PipelineStatisticsQueryUtilities::verifyResultValues
                          ((_test_execution_result *)local_70,1,&executeTest::expected_value,
                           (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id != 0,
                           current_query_target,
                           &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                            m_current_draw_call_type,
                           &(this->super_PipelineStatisticsQueryTestFunctionalBase).
                            m_current_primitive_type,false,
                           (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx,
                           VERIFICATION_TYPE_EQUAL_OR_GREATER);
        run_result.result_uint64._7_1_ = (run_result.result_uint64._7_1_ & 1 & bVar1) != 0;
      }
      else {
        this_00 = tcu::TestContext::getLog
                            ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                             super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_228,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_228,
                            (char (*) [55])"Could not retrieve test run results for query target [")
        ;
        PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                  (&local_258,(PipelineStatisticsQueryUtilities *)(ulong)current_query_target,value)
        ;
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_258);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29ea7ce);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_258);
        tcu::MessageBuilder::~MessageBuilder(&local_228);
        run_result.result_uint64._7_1_ = 0;
      }
    }
  }
  return (bool)(run_result.result_uint64._7_1_ & 1);
}

Assistant:

bool PipelineStatisticsQueryTestFunctional5::executeTest(glw::GLenum current_query_target)
{
	const glw::Functions&									 gl		= m_context.getRenderContext().getFunctions();
	bool													 result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result run_result;

	/* Sanity check: This method should only be called for GL_TESS_CONTROL_SHADER_PATCHES_ARB and
	 * GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB queries. */
	DE_ASSERT(current_query_target == GL_TESS_CONTROL_SHADER_PATCHES_ARB ||
			  current_query_target == GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB);

	/* Set up VBO. */
	const unsigned int n_vertex_components = 2;
	const float		   vertex_data[]	   = {
		-0.1f, 0.2f, 0.2f, -0.7f, 0.5f, -0.5f,
	};
	const unsigned int index_data[] = { 2, 1, 0 };

	m_indirect_draw_call_baseinstance_argument = 1;
	m_indirect_draw_call_basevertex_argument   = 1;
	m_indirect_draw_call_count_argument		   = 3; /* default GL_PATCH_VERTICES value */
	m_indirect_draw_call_first_argument		   = 0;
	m_indirect_draw_call_primcount_argument	= 4;

	initVBO(vertex_data, sizeof(vertex_data), index_data, sizeof(index_data), m_indirect_draw_call_count_argument,
			m_indirect_draw_call_primcount_argument, m_indirect_draw_call_baseinstance_argument,
			m_indirect_draw_call_first_argument, m_indirect_draw_call_basevertex_argument);

	initVAO(n_vertex_components);

	/* Set up the primitive type */
	m_current_primitive_type = PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES;

	/* Iterate through all draw call types */
	for (unsigned int n_draw_call_type = 0; n_draw_call_type < PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_COUNT;
		 ++n_draw_call_type)
	{
		m_current_draw_call_type = (PipelineStatisticsQueryUtilities::_draw_call_type)n_draw_call_type;

		/* Only continue if the draw call is supported by the context */
		if (!PipelineStatisticsQueryUtilities::isDrawCallSupported(m_current_draw_call_type, gl))
		{
			continue;
		}

		/* Execute the query */
		if (!PipelineStatisticsQueryUtilities::executeQuery(
				current_query_target, m_qo_id, m_bo_qo_id, queryCallbackDrawCallHandler,
				(PipelineStatisticsQueryTestFunctionalBase*)this, m_context.getRenderContext(), m_testCtx,
				m_context.getContextInfo(), &run_result))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Could not retrieve test run results for query target "
														   "["
							   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target) << "]"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
		else
		{
			static const glw::GLuint64 expected_value = 1; /* as per test spec */

			/* Compare it against query result values */
			result &= PipelineStatisticsQueryUtilities::verifyResultValues(
				run_result, 1, &expected_value, m_qo_id != 0, /* should_check_qo_bo_values */
				current_query_target, &m_current_draw_call_type, &m_current_primitive_type,
				false, /* is_primitive_restart_enabled */
				m_testCtx, PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EQUAL_OR_GREATER);

		} /* if (run results were obtained successfully) */
	}	 /* for (all draw call types) */

	return result;
}